

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

fsg_model_t * fsg_model_read(FILE *fp,logmath_t *lmath,float32 lw)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int32 iVar4;
  char *pcVar5;
  hash_iter_t *phVar6;
  fsg_model_t *fsg;
  fsg_link_t *ptr;
  glist_t pgVar7;
  char **ppcVar8;
  char *pcVar9;
  long lVar10;
  size_t n_elem;
  ulong uVar11;
  hash_table_t *phVar12;
  float fVar13;
  double dVar14;
  int32 lineno;
  char **wordptr;
  hash_table_t *local_78;
  int32 j;
  int32 i;
  char *lineptr;
  ulong local_60;
  FILE *local_58;
  int local_50;
  int32 wid;
  ulong local_48;
  logmath_t *local_40;
  int n_state;
  
  local_60 = CONCAT44(local_60._4_4_,lw);
  lineno = 0;
  local_58 = fp;
  local_40 = lmath;
  local_78 = hash_table_new(0x20,0);
  wordptr = (char **)0x0;
  lineptr = (char *)0x0;
  do {
    uVar2 = nextline_str2words(local_58,&lineno,&lineptr,&wordptr);
    ppcVar8 = wordptr;
    if ((int)uVar2 < 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,0x21f,"%s declaration missing\n","FSG_BEGIN");
      goto LAB_0010a9e2;
    }
    iVar3 = strcmp(*wordptr,"FSG_BEGIN");
  } while (iVar3 != 0);
  if (2 < uVar2) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
            ,0x226,"Line[%d]: malformed FSG_BEGIN declaration\n",(ulong)(uint)lineno);
LAB_0010a9e2:
    pgVar7 = (glist_t)0x0;
    fsg = (fsg_model_t *)0x0;
LAB_0010a9e8:
    pcVar5 = (char *)0x0;
    phVar12 = local_78;
    goto LAB_0010aae1;
  }
  if (uVar2 == 2) {
    pcVar5 = ppcVar8[1];
    iVar3 = 0x230;
  }
  else {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
            ,0x233,"FSG name is missing\n");
    pcVar5 = "unknown";
    iVar3 = 0x234;
  }
  pcVar5 = __ckd_salloc__(pcVar5,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                          ,iVar3);
  phVar12 = local_78;
  iVar4 = nextline_str2words(local_58,&lineno,&lineptr,&wordptr);
  ppcVar8 = wordptr;
  if ((iVar4 != 2) ||
     ((((pcVar9 = *wordptr, *pcVar9 != 'N' || (pcVar9[1] != '\0')) &&
       (iVar3 = strcmp(pcVar9,"NUM_STATES"), iVar3 != 0)) ||
      (iVar3 = __isoc99_sscanf(ppcVar8[1],"%d",&n_state), n_state < 1 || iVar3 != 1)))) {
    pgVar7 = (glist_t)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
            ,0x240,"Line[%d]: #states declaration line missing or malformed\n",(ulong)(uint)lineno);
    fsg = (fsg_model_t *)0x0;
    goto LAB_0010aae1;
  }
  fsg = fsg_model_init(pcVar5,local_40,(float32)local_60,n_state);
  ckd_free(pcVar5);
  iVar4 = nextline_str2words(local_58,&lineno,&lineptr,&wordptr);
  ppcVar8 = wordptr;
  if ((iVar4 == 2) &&
     (((pcVar5 = *wordptr, *pcVar5 == 'S' && (pcVar5[1] == '\0')) ||
      (iVar3 = strcmp(pcVar5,"START_STATE"), iVar3 == 0)))) {
    iVar3 = __isoc99_sscanf(ppcVar8[1],"%d",&fsg->start_state);
    if (((iVar3 != 1) || (iVar3 = fsg->start_state, iVar3 < 0)) || (fsg->n_state <= iVar3))
    goto LAB_0010ae7a;
    iVar4 = nextline_str2words(local_58,&lineno,&lineptr,&wordptr);
    ppcVar8 = wordptr;
    if ((iVar4 == 2) &&
       (((pcVar5 = *wordptr, *pcVar5 == 'F' && (pcVar5[1] == '\0')) ||
        (iVar3 = strcmp(pcVar5,"FINAL_STATE"), iVar3 == 0)))) {
      iVar3 = __isoc99_sscanf(ppcVar8[1],"%d",&fsg->final_state);
      if (((iVar3 == 1) && (iVar3 = fsg->final_state, -1 < iVar3)) && (iVar3 < fsg->n_state)) {
        local_60 = 0;
        local_48 = 0;
        pgVar7 = (glist_t)0x0;
        local_50 = 0;
        while (uVar2 = nextline_str2words(local_58,&lineno,&lineptr,&wordptr), ppcVar8 = wordptr,
              0 < (int)uVar2) {
          pcVar5 = *wordptr;
          iVar3 = strcmp(pcVar5,"FSG_END");
          phVar12 = local_78;
          if (iVar3 == 0) {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                    ,0x2aa,"FSG: %d states, %d unique words, %d transitions (%d null)\n",
                    (ulong)(uint)fsg->n_state,(ulong)(uint)local_78->inuse,local_60,local_48);
            iVar3 = phVar12->inuse;
            fsg->n_word = iVar3;
            n_elem = (long)iVar3 + 10;
            fsg->n_word_alloc = (int32)n_elem;
            ppcVar8 = (char **)__ckd_calloc__(n_elem,8,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                              ,0x2b0);
            fsg->vocab = ppcVar8;
            for (phVar6 = hash_table_iter(phVar12); phVar6 != (hash_iter_t *)0x0;
                phVar6 = hash_table_iter_next(phVar6)) {
              fsg->vocab[*(int *)&phVar6->ent->val] = phVar6->ent->key;
            }
            hash_table_free(local_78);
            pgVar7 = fsg_model_null_trans_closure(fsg,pgVar7);
            glist_free(pgVar7);
            ckd_free(lineptr);
            ckd_free(wordptr);
            return fsg;
          }
          if (((*pcVar5 != 'T') || (pcVar5[1] != '\0')) &&
             (iVar3 = strcmp(pcVar5,"TRANSITION"), iVar3 != 0)) {
            uVar11 = (ulong)(uint)lineno;
            pcVar5 = "Line[%d]: transition or FSG_END statement expected\n";
            lVar10 = 0x28f;
            goto LAB_0010aff8;
          }
          if (((((uVar2 - 6 < 0xfffffffe) ||
                (iVar3 = __isoc99_sscanf(ppcVar8[1],"%d",&i), iVar3 != 1)) ||
               (iVar3 = __isoc99_sscanf(ppcVar8[2],"%d",&j), iVar3 != 1)) ||
              ((i < 0 || (fsg->n_state <= i)))) || ((j < 0 || (fsg->n_state <= j)))) {
            uVar11 = (ulong)(uint)lineno;
            pcVar5 = 
            "Line[%d]: transition spec malformed; Expecting: from-state to-state trans-prob [word]\n"
            ;
            lVar10 = 0x281;
            goto LAB_0010aff8;
          }
          dVar14 = atof_c(ppcVar8[3]);
          fVar13 = (float)dVar14;
          if ((fVar13 <= 0.0) || (1.0 < fVar13)) {
            uVar11 = (ulong)(uint)lineno;
            pcVar5 = 
            "Line[%d]: transition spec malformed; Expecting float as transition probability\n";
            lVar10 = 0x289;
            goto LAB_0010aff8;
          }
          iVar3 = logmath_log(local_40,(float64)(double)fVar13);
          iVar3 = (int)((float)iVar3 * (float)fsg->lw);
          if (uVar2 < 5) {
            iVar4 = fsg_model_null_trans_add(fsg,i,j,iVar3);
            if (iVar4 == 1) {
              local_48 = (ulong)((int)local_48 + 1);
              ptr = fsg_model_null_trans(fsg,i,j);
              pgVar7 = glist_add_ptr(pgVar7,ptr);
            }
          }
          else {
            iVar4 = hash_table_lookup_int32(local_78,ppcVar8[4],&wid);
            if (iVar4 < 0) {
              pcVar5 = __ckd_salloc__(ppcVar8[4],
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                      ,0x298);
              iVar1 = local_50;
              hash_table_enter(local_78,pcVar5,(void *)(long)local_50);
              wid = iVar1;
              local_50 = iVar1 + 1;
            }
            fsg_model_trans_add(fsg,i,j,iVar3,wid);
            local_60 = (ulong)((int)local_60 + 1);
          }
        }
        uVar11 = (ulong)(uint)lineno;
        pcVar5 = "Line[%d]: transition or FSG_END statement expected\n";
        lVar10 = 0x26e;
LAB_0010aff8:
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                ,lVar10,pcVar5,uVar11);
        goto LAB_0010a9e8;
      }
    }
    pcVar9 = "Line[%d]: final state declaration line missing or malformed\n";
    lVar10 = 0x261;
  }
  else {
LAB_0010ae7a:
    pcVar9 = "Line[%d]: start state declaration line missing or malformed\n";
    lVar10 = 0x253;
  }
  pcVar5 = (char *)0x0;
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
          ,lVar10,pcVar9,(ulong)(uint)lineno);
  pgVar7 = (glist_t)0x0;
LAB_0010aae1:
  for (phVar6 = hash_table_iter(phVar12); phVar6 != (hash_iter_t *)0x0;
      phVar6 = hash_table_iter_next(phVar6)) {
    ckd_free(phVar6->ent->key);
  }
  glist_free(pgVar7);
  hash_table_free(phVar12);
  ckd_free(pcVar5);
  ckd_free(lineptr);
  ckd_free(wordptr);
  fsg_model_free(fsg);
  return (fsg_model_t *)0x0;
}

Assistant:

fsg_model_t *
fsg_model_read(FILE * fp, logmath_t * lmath, float32 lw)
{
    fsg_model_t *fsg;
    hash_table_t *vocab;
    hash_iter_t *itor;
    int32 lastwid;
    char **wordptr;
    char *lineptr;
    char *fsgname;
    int32 lineno;
    int32 n, i, j;
    int n_state, n_trans, n_null_trans;
    glist_t nulls;
    float32 p;

    lineno = 0;
    vocab = hash_table_new(32, FALSE);
    wordptr = NULL;
    lineptr = NULL;
    nulls = NULL;
    fsgname = NULL;
    fsg = NULL;

    /* Scan upto FSG_BEGIN header */
    for (;;) {
        n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
        if (n < 0) {
            E_ERROR("%s declaration missing\n", FSG_MODEL_BEGIN_DECL);
            goto parse_error;
        }

        if ((strcmp(wordptr[0], FSG_MODEL_BEGIN_DECL) == 0)) {
            if (n > 2) {
                E_ERROR("Line[%d]: malformed FSG_BEGIN declaration\n",
                        lineno);
                goto parse_error;
            }
            break;
        }
    }
    /* Save FSG name, or it will get clobbered below :(.
     * If name is missing, try the default.
     */
    if (n == 2) {
        fsgname = ckd_salloc(wordptr[1]);
    }
    else {
        E_WARN("FSG name is missing\n");
        fsgname = ckd_salloc("unknown");
    }

    /* Read #states */
    n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
    if ((n != 2)
        || ((strcmp(wordptr[0], FSG_MODEL_N_DECL) != 0)
            && (strcmp(wordptr[0], FSG_MODEL_NUM_STATES_DECL) != 0))
        || (sscanf(wordptr[1], "%d", &n_state) != 1)
        || (n_state <= 0)) {
        E_ERROR
            ("Line[%d]: #states declaration line missing or malformed\n",
             lineno);
        goto parse_error;
    }

    /* Now create the FSG. */
    fsg = fsg_model_init(fsgname, lmath, lw, n_state);
    ckd_free(fsgname);
    fsgname = NULL;

    /* Read start state */
    n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
    if ((n != 2)
        || ((strcmp(wordptr[0], FSG_MODEL_S_DECL) != 0)
            && (strcmp(wordptr[0], FSG_MODEL_START_STATE_DECL) != 0))
        || (sscanf(wordptr[1], "%d", &(fsg->start_state)) != 1)
        || (fsg->start_state < 0)
        || (fsg->start_state >= fsg->n_state)) {
        E_ERROR
            ("Line[%d]: start state declaration line missing or malformed\n",
             lineno);
        goto parse_error;
    }

    /* Read final state */
    n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
    if ((n != 2)
        || ((strcmp(wordptr[0], FSG_MODEL_F_DECL) != 0)
            && (strcmp(wordptr[0], FSG_MODEL_FINAL_STATE_DECL) != 0))
        || (sscanf(wordptr[1], "%d", &(fsg->final_state)) != 1)
        || (fsg->final_state < 0)
        || (fsg->final_state >= fsg->n_state)) {
        E_ERROR
            ("Line[%d]: final state declaration line missing or malformed\n",
             lineno);
        goto parse_error;
    }

    /* Read transitions */
    lastwid = 0;
    n_trans = n_null_trans = 0;
    for (;;) {
        int32 wid, tprob;

        n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
        if (n <= 0) {
            E_ERROR("Line[%d]: transition or FSG_END statement expected\n",
                    lineno);
            goto parse_error;
        }

        if ((strcmp(wordptr[0], FSG_MODEL_END_DECL) == 0)) {
            break;
        }

        if ((strcmp(wordptr[0], FSG_MODEL_T_DECL) == 0)
            || (strcmp(wordptr[0], FSG_MODEL_TRANSITION_DECL) == 0)) {


            if (((n != 4) && (n != 5))
                || (sscanf(wordptr[1], "%d", &i) != 1)
                || (sscanf(wordptr[2], "%d", &j) != 1)
                || (i < 0) || (i >= fsg->n_state)
                || (j < 0) || (j >= fsg->n_state)) {
                E_ERROR
                    ("Line[%d]: transition spec malformed; Expecting: from-state to-state trans-prob [word]\n",
                     lineno);
                goto parse_error;
            }

            p = atof_c(wordptr[3]);
            if ((p <= 0.0) || (p > 1.0)) {
                E_ERROR
                    ("Line[%d]: transition spec malformed; Expecting float as transition probability\n",
                     lineno);
                goto parse_error;
            }
        }
        else {
            E_ERROR("Line[%d]: transition or FSG_END statement expected\n",
                    lineno);
            goto parse_error;
        }

        tprob = (int32) (logmath_log(lmath, p) * fsg->lw);
        /* Add word to "dictionary". */
        if (n > 4) {
            if (hash_table_lookup_int32(vocab, wordptr[4], &wid) < 0) {
                (void) hash_table_enter_int32(vocab,
                                              ckd_salloc(wordptr[4]),
                                              lastwid);
                wid = lastwid;
                ++lastwid;
            }
            fsg_model_trans_add(fsg, i, j, tprob, wid);
            ++n_trans;
        }
        else {
            if (fsg_model_null_trans_add(fsg, i, j, tprob) == 1) {
                ++n_null_trans;
                nulls =
                    glist_add_ptr(nulls, fsg_model_null_trans(fsg, i, j));
            }
        }
    }

    E_INFO("FSG: %d states, %d unique words, %d transitions (%d null)\n",
           fsg->n_state, hash_table_inuse(vocab), n_trans, n_null_trans);


    /* Now create a string table from the "dictionary" */
    fsg->n_word = hash_table_inuse(vocab);
    fsg->n_word_alloc = fsg->n_word + 10;       /* Pad it a bit. */
    fsg->vocab = ckd_calloc(fsg->n_word_alloc, sizeof(*fsg->vocab));
    for (itor = hash_table_iter(vocab); itor;
         itor = hash_table_iter_next(itor)) {
        char const *word = hash_entry_key(itor->ent);
        int32 wid = (int32) (size_t) hash_entry_val(itor->ent);
        fsg->vocab[wid] = (char *) word;
    }
    hash_table_free(vocab);

    /* Do transitive closure on null transitions.  FIXME: This is
     * actually quite inefficient as it *creates* a lot of new links
     * as opposed to just *calculating* the epsilon-closure for each
     * state.  Ideally we would epsilon-remove or determinize the FSG
     * (but note that tag transitions are not really epsilons...) */
    nulls = fsg_model_null_trans_closure(fsg, nulls);
    glist_free(nulls);

    ckd_free(lineptr);
    ckd_free(wordptr);

    return fsg;

  parse_error:
    for (itor = hash_table_iter(vocab); itor;
         itor = hash_table_iter_next(itor))
        ckd_free((char *) hash_entry_key(itor->ent));
    glist_free(nulls);
    hash_table_free(vocab);
    ckd_free(fsgname);
    ckd_free(lineptr);
    ckd_free(wordptr);
    fsg_model_free(fsg);
    return NULL;
}